

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

int __thiscall network::init(network *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  fepoll *this_00;
  bool bVar2;
  network *this_local;
  
  this_00 = (fepoll *)operator_new(0x10);
  fepoll::fepoll(this_00);
  this->frame_ = (iframe *)this_00;
  uVar1 = (**this->frame_->_vptr_iframe)();
  bVar2 = (uVar1 & 1) != 0;
  if (!bVar2) {
    uVar1 = (*this->frame_->_vptr_iframe[1])();
  }
  return CONCAT31((int3)(uVar1 >> 8),bVar2);
}

Assistant:

bool network::init()
{
#ifdef __linux__
    frame_ = new fepoll();
#endif
#ifdef __APPLE__
    frame_ = new fkqueue();
#endif
#ifdef _MSC_VER
    frame_ = new fselect();
#endif
    if (!frame_->init())
    {
        frame_->release();
        return false;
    }
    return true;
}